

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tlstree.c
# Opt level: O3

int main(void)

{
  int iVar1;
  uint uVar2;
  EVP_MD_CTX *pEVar3;
  char *pcVar4;
  EVP_MD *type;
  EVP_PKEY *pEVar5;
  FILE *ctx;
  uchar *key;
  long extraout_RDX;
  FILE *__stream;
  ulong uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uchar rec63_header [5];
  uchar seq63 [8];
  uchar seq0 [8];
  size_t mac_len;
  uchar rec0_header [5];
  uchar data0 [15];
  uchar mac63 [16];
  uchar mac0 [16];
  uchar full_iv [16];
  uchar enc_key [32];
  uchar data0_processed [31];
  uchar data63 [4096];
  uchar data63_processed [4112];
  undefined4 local_2110;
  undefined1 local_210c;
  char local_2108 [8];
  undefined8 local_2100;
  uint local_20f8 [2];
  undefined4 local_20f0;
  undefined1 local_20ec;
  uchar local_20e8 [16];
  uchar local_20d8;
  char cStack_20d7;
  char cStack_20d6;
  char cStack_20d5;
  char cStack_20d4;
  char cStack_20d3;
  char cStack_20d2;
  char cStack_20d1;
  char cStack_20d0;
  char cStack_20cf;
  char cStack_20ce;
  char cStack_20cd;
  char cStack_20cc;
  char cStack_20cb;
  char cStack_20ca;
  char cStack_20c9;
  uchar local_20c8;
  char cStack_20c7;
  char cStack_20c6;
  char cStack_20c5;
  char cStack_20c4;
  char cStack_20c3;
  char cStack_20c2;
  char cStack_20c1;
  char cStack_20c0;
  char cStack_20bf;
  char cStack_20be;
  char cStack_20bd;
  char cStack_20bc;
  char cStack_20bb;
  char cStack_20ba;
  char cStack_20b9;
  undefined1 local_20b8 [16];
  undefined1 local_20a8 [16];
  undefined1 local_2098 [16];
  uchar local_2088;
  char cStack_2087;
  char cStack_2086;
  char cStack_2085;
  char cStack_2084;
  char cStack_2083;
  char cStack_2082;
  char cStack_2081;
  char cStack_2080;
  char cStack_207f;
  char cStack_207e;
  char cStack_207d;
  char cStack_207c;
  char cStack_207b;
  char cStack_207a;
  uchar uStack_2079;
  char cStack_2078;
  char cStack_2077;
  char cStack_2076;
  char cStack_2075;
  char cStack_2074;
  char cStack_2073;
  char cStack_2072;
  char cStack_2071;
  char cStack_2070;
  char cStack_206f;
  char cStack_206e;
  char cStack_206d;
  char cStack_206c;
  char cStack_206b;
  char cStack_206a;
  uchar local_2068 [4128];
  uchar local_1048;
  char cStack_1047;
  char cStack_1046;
  char cStack_1045;
  char cStack_1044;
  char cStack_1043;
  char cStack_1042;
  char cStack_1041;
  char cStack_1040;
  char cStack_103f;
  char cStack_103e;
  char cStack_103d;
  char cStack_103c;
  char cStack_103b;
  char cStack_103a;
  char cStack_1039;
  char local_1038;
  char cStack_1037;
  char cStack_1036;
  char cStack_1035;
  char cStack_1034;
  char cStack_1033;
  char cStack_1032;
  char cStack_1031;
  char cStack_1030;
  char cStack_102f;
  char cStack_102e;
  char cStack_102d;
  char cStack_102c;
  char cStack_102b;
  char cStack_102a;
  char cStack_1029;
  uchar local_48 [24];
  
  local_2068[0x10] = 0xff;
  local_2068[0x11] = 0xff;
  local_2068[0x12] = 0xff;
  local_2068[0x13] = 0xff;
  local_2068[0x14] = 0xff;
  local_2068[0x15] = 0xff;
  local_2068[0x16] = 0xff;
  local_2068[0x17] = 0xff;
  local_2068[0x18] = 0xff;
  local_2068[0x19] = 0xff;
  local_2068[0x1a] = 0xff;
  local_2068[0x1b] = 0xff;
  local_2068[0x1c] = 0xff;
  local_2068[0x1d] = 0xff;
  local_2068[0x1e] = 0xff;
  local_2068[0x1f] = 0xff;
  local_2068[0] = 0xff;
  local_2068[1] = 0xff;
  local_2068[2] = 0xff;
  local_2068[3] = 0xff;
  local_2068[4] = 0xff;
  local_2068[5] = 0xff;
  local_2068[6] = 0xff;
  local_2068[7] = 0xff;
  local_2068[8] = 0xff;
  local_2068[9] = 0xff;
  local_2068[10] = 0xff;
  local_2068[0xb] = 0xff;
  local_2068[0xc] = 0xff;
  local_2068[0xd] = 0xff;
  local_2068[0xe] = 0xff;
  local_2068[0xf] = 0xff;
  local_2098 = (undefined1  [16])0x0;
  local_20a8 = (undefined1  [16])0x0;
  local_20b8 = (undefined1  [16])0x0;
  local_2100 = 0;
  local_20ec = 0xf;
  local_20f0 = 0x30317;
  local_20e8[8] = '\0';
  local_20e8[9] = '\0';
  local_20e8[10] = '\0';
  local_20e8[0xb] = '\0';
  local_20e8[0xc] = '\0';
  local_20e8[0xd] = '\0';
  local_20e8[0xe] = '\0';
  local_20e8[0] = '\0';
  local_20e8[1] = '\0';
  local_20e8[2] = '\0';
  local_20e8[3] = '\0';
  local_20e8[4] = '\0';
  local_20e8[5] = '\0';
  local_20e8[6] = '\0';
  local_20e8[7] = 0;
  local_2108[0] = '\0';
  local_2108[1] = '\0';
  local_2108[2] = '\0';
  local_2108[3] = '\0';
  local_2108[4] = '\0';
  local_2108[5] = '\0';
  local_2108[6] = '\0';
  local_2108[7] = '?';
  local_210c = 0;
  local_2110 = 0x10030317;
  pEVar3 = (EVP_MD_CTX *)EVP_MD_CTX_new();
  OPENSSL_init_crypto(0x40);
  memset(local_2068 + 0x20,0,0x1000);
  pcVar4 = OBJ_nid2sn(0x3f9);
  type = EVP_get_digestbyname(pcVar4);
  EVP_DigestInit_ex(pEVar3,type,(ENGINE *)0x0);
  pEVar5 = EVP_PKEY_new_mac_key(0x3f9,(ENGINE *)0x0,local_2068,0x20);
  EVP_DigestSignInit(pEVar3,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,pEVar5);
  EVP_PKEY_free(pEVar5);
  EVP_MD_CTX_ctrl(pEVar3,4,0,&local_2100);
  EVP_DigestSignUpdate(pEVar3,&local_2100,8);
  EVP_DigestSignUpdate(pEVar3,&local_20f0,5);
  EVP_DigestSignUpdate(pEVar3,local_20e8,0xf);
  EVP_DigestSignFinal(pEVar3,&local_20c8,(size_t *)local_20f8);
  EVP_MD_CTX_free(pEVar3);
  pcVar4 = "MAC0 result";
  __stream = _stderr;
  uVar2 = local_20f8[0];
  hexdump((FILE *)_stderr,"MAC0 result",&local_20c8,local_20f8[0]);
  auVar8[0] = -(local_20c8 == 'u');
  auVar8[1] = -(cStack_20c7 == 'S');
  auVar8[2] = -(cStack_20c6 == '\t');
  auVar8[3] = -(cStack_20c5 == -0x35);
  auVar8[4] = -(cStack_20c4 == -0x39);
  auVar8[5] = -(cStack_20c3 == ';');
  auVar8[6] = -(cStack_20c2 == -0x47);
  auVar8[7] = -(cStack_20c1 == 'I');
  auVar8[8] = -(cStack_20c0 == -0x3b);
  auVar8[9] = -(cStack_20bf == '\x0e');
  auVar8[10] = -(cStack_20be == -0x45);
  auVar8[0xb] = -(cStack_20bd == -0x7a);
  auVar8[0xc] = -(cStack_20bc == '\x16');
  auVar8[0xd] = -(cStack_20bb == '\n');
  auVar8[0xe] = -(cStack_20ba == '\x0f');
  auVar8[0xf] = -(cStack_20b9 == -0x12);
  if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf) ==
      0xffff) {
    pcVar4 = OBJ_nid2sn(0x499);
    pcVar4 = (char *)EVP_get_cipherbyname(pcVar4);
    ctx = (FILE *)EVP_CIPHER_CTX_new();
    key = local_20a8;
    __stream = ctx;
    iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)ctx,(EVP_CIPHER *)pcVar4,(ENGINE *)0x0,key,
                               local_20b8);
    uVar2 = (uint)key;
    if (iVar1 < 1) goto LAB_001017f6;
    uVar2 = 7;
    do {
      uVar6 = (ulong)uVar2;
      bVar7 = uVar2 != 0;
      uVar2 = uVar2 - 1;
      pcVar4 = (char *)((long)local_20f8 + (uVar6 - 8));
      *pcVar4 = *pcVar4 + '\x01';
      if (*pcVar4 != '\0') break;
    } while (bVar7);
    EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)ctx,0x2a,0,&local_2100);
    EVP_Cipher((EVP_CIPHER_CTX *)ctx,&local_2088,local_20e8,0xf);
    EVP_Cipher((EVP_CIPHER_CTX *)ctx,&uStack_2079,&local_20c8,0x10);
    pcVar4 = "ENC0 result";
    uVar2 = 0x1f;
    __stream = _stderr;
    hexdump((FILE *)_stderr,"ENC0 result",&local_2088,0x1f);
    auVar12[0] = -(uStack_2079 == '\0');
    auVar12[1] = -(cStack_2078 == -0x2b);
    auVar12[2] = -(cStack_2077 == ';');
    auVar12[3] = -(cStack_2076 == 'A');
    auVar12[4] = -(cStack_2075 == 'R');
    auVar12[5] = -(cStack_2074 == 'z');
    auVar12[6] = -(cStack_2073 == '&');
    auVar12[7] = -(cStack_2072 == '\x1e');
    auVar12[8] = -(cStack_2071 == -0x21);
    auVar12[9] = -(cStack_2070 == -0x3e);
    auVar12[10] = -(cStack_206f == -0x46);
    auVar12[0xb] = -(cStack_206e == 'x');
    auVar12[0xc] = -(cStack_206d == 'W');
    auVar12[0xd] = -(cStack_206c == -0x3f);
    auVar12[0xe] = -(cStack_206b == -0x6d);
    auVar12[0xf] = -(cStack_206a == '-');
    auVar9[0] = -(local_2088 == 0xf3);
    auVar9[1] = -(cStack_2087 == '\x17');
    auVar9[2] = -(cStack_2086 == -0x59);
    auVar9[3] = -(cStack_2085 == '\x1d');
    auVar9[4] = -(cStack_2084 == ':');
    auVar9[5] = -(cStack_2083 == -0x32);
    auVar9[6] = -(cStack_2082 == 'C');
    auVar9[7] = -(cStack_2081 == ';');
    auVar9[8] = -(cStack_2080 == '\x01');
    auVar9[9] = -(cStack_207f == -0x2c);
    auVar9[10] = -(cStack_207e == -0x19);
    auVar9[0xb] = -(cStack_207d == -0x2c);
    auVar9[0xc] = -(cStack_207c == -0x11);
    auVar9[0xd] = -(cStack_207b == 'a');
    auVar9[0xe] = -(cStack_207a == -0x52);
    auVar9[0xf] = -(uStack_2079 == '\0');
    auVar9 = auVar9 & auVar12;
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001017fb;
    pEVar3 = (EVP_MD_CTX *)EVP_MD_CTX_new();
    EVP_DigestInit_ex(pEVar3,type,(ENGINE *)0x0);
    pEVar5 = EVP_PKEY_new_mac_key(0x3f9,(ENGINE *)0x0,local_2068,0x20);
    EVP_DigestSignInit(pEVar3,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,pEVar5);
    EVP_PKEY_free(pEVar5);
    EVP_MD_CTX_ctrl(pEVar3,4,0,local_2108);
    EVP_DigestSignUpdate(pEVar3,local_2108,8);
    EVP_DigestSignUpdate(pEVar3,&local_2110,5);
    EVP_DigestSignUpdate(pEVar3,local_2068 + 0x20,0x1000);
    EVP_DigestSignFinal(pEVar3,&local_20d8,(size_t *)local_20f8);
    EVP_MD_CTX_free(pEVar3);
    pcVar4 = "MAC63 result";
    __stream = _stderr;
    uVar2 = local_20f8[0];
    hexdump((FILE *)_stderr,"MAC63 result",&local_20d8,local_20f8[0]);
    auVar10[0] = -(local_20d8 == '\n');
    auVar10[1] = -(cStack_20d7 == ';');
    auVar10[2] = -(cStack_20d6 == -3);
    auVar10[3] = -(cStack_20d5 == 'C');
    auVar10[4] = -(cStack_20d4 == '\x0f');
    auVar10[5] = -(cStack_20d3 == -0x33);
    auVar10[6] = -(cStack_20d2 == -0x28);
    auVar10[7] = -(cStack_20d1 == -0x28);
    auVar10[8] = -(cStack_20d0 == '\\');
    auVar10[9] = -(cStack_20cf == -0x6a);
    auVar10[10] = -(cStack_20ce == 'F');
    auVar10[0xb] = -(cStack_20cd == -0x7a);
    auVar10[0xc] = -(cStack_20cc == -0x7f);
    auVar10[0xd] = -(cStack_20cb == 'x');
    auVar10[0xe] = -(cStack_20ca == 'O');
    auVar10[0xf] = -(cStack_20c9 == '}');
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00101800;
    uVar2 = 7;
    do {
      uVar6 = (ulong)uVar2;
      bVar7 = uVar2 != 0;
      uVar2 = uVar2 - 1;
      pcVar4 = local_2108 + uVar6;
      *pcVar4 = *pcVar4 + '\x01';
      if (*pcVar4 != '\0') break;
    } while (bVar7);
    EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)ctx,0x2a,0,local_2108);
    EVP_Cipher((EVP_CIPHER_CTX *)ctx,&local_1048,local_2068 + 0x20,0x1000);
    EVP_Cipher((EVP_CIPHER_CTX *)ctx,local_48,&local_20d8,0x10);
    pcVar4 = "ENC63 result: head";
    uVar2 = 0x20;
    hexdump((FILE *)_stderr,"ENC63 result: head",&local_1048,0x20);
    auVar13[0] = -(local_1038 == -0x26);
    auVar13[1] = -(cStack_1037 == -0x7c);
    auVar13[2] = -(cStack_1036 == -0x29);
    auVar13[3] = -(cStack_1035 == 'v');
    auVar13[4] = -(cStack_1034 == -0x3d);
    auVar13[5] = -(cStack_1033 == -0x61);
    auVar13[6] = -(cStack_1032 == '\\');
    auVar13[7] = -(cStack_1031 == -0x24);
    auVar13[8] = -(cStack_1030 == '7');
    auVar13[9] = -(cStack_102f == ' ');
    auVar13[10] = -(cStack_102e == -0x49);
    auVar13[0xb] = -(cStack_102d == -0x4b);
    auVar13[0xc] = -(cStack_102c == 'Y');
    auVar13[0xd] = -(cStack_102b == -0x11);
    auVar13[0xe] = -(cStack_102a == '\x13');
    auVar13[0xf] = -(cStack_1029 == -99);
    auVar11[0] = -(local_1048 == 'j');
    auVar11[1] = -(cStack_1047 == '\x18');
    auVar11[2] = -(cStack_1046 == '8');
    auVar11[3] = -(cStack_1045 == -0x50);
    auVar11[4] = -(cStack_1044 == -0x60);
    auVar11[5] = -(cStack_1043 == -0x2b);
    auVar11[6] = -(cStack_1042 == -0x60);
    auVar11[7] = -(cStack_1041 == 'M');
    auVar11[8] = -(cStack_1040 == '\x1f');
    auVar11[9] = -(cStack_103f == ')');
    auVar11[10] = -(cStack_103e == 'd');
    auVar11[0xb] = -(cStack_103d == -0x77);
    auVar11[0xc] = -(cStack_103c == 'm');
    auVar11[0xd] = -(cStack_103b == '\b');
    auVar11[0xe] = -(cStack_103a == '_');
    auVar11[0xf] = -(cStack_1039 == -0x49);
    auVar11 = auVar11 & auVar13;
    __stream = _stderr;
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff) {
      pcVar4 = &stack0xffffffffffffff98;
      uVar2 = 0x30;
      hexdump((FILE *)_stderr,"ENC63 result: tail",(uchar *)pcVar4,0x30);
      __stream = (FILE *)&DAT_001020a0;
      iVar1 = bcmp(&DAT_001020a0,pcVar4,0x30);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0010180a;
    }
  }
  else {
    main_cold_1();
LAB_001017f6:
    main_cold_6();
LAB_001017fb:
    main_cold_2();
LAB_00101800:
    main_cold_3();
  }
  main_cold_4();
LAB_0010180a:
  main_cold_5();
  fputs(pcVar4,__stream);
  if (0 < (int)uVar2) {
    uVar6 = 0;
    do {
      if ((uVar6 & 0xf) == 0) {
        fprintf(__stream,"\n%04x",uVar6 & 0xffffffff);
      }
      fprintf(__stream," %02x",(ulong)*(byte *)(extraout_RDX + uVar6));
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  iVar1 = fputc(10,__stream);
  return iVar1;
}

Assistant:

int main(void)
{
#ifdef EVP_MD_CTRL_TLSTREE
	const unsigned char mac_secret[] = {
0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
	};

	const unsigned char enc_key[] = {
0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
	};

	const unsigned char full_iv[] = {
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
	};


	unsigned char seq0[] = {
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
	};

	const unsigned char rec0_header[] = {
0x17, 0x03, 0x03, 0x00, 0x0F
	};

	const unsigned char data0[15] = {
0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00
	};

	const unsigned char mac0_etl[16] = {
0x75, 0x53, 0x09, 0xCB, 0xC7, 0x3B, 0xB9, 0x49, 0xC5, 0x0E, 0xBB, 0x86, 0x16, 0x0A, 0x0F, 0xEE
	};

	const unsigned char enc0_etl[31] = {
0xf3, 0x17, 0xa7, 0x1d, 0x3a, 0xce, 0x43, 0x3b, 0x01, 0xd4, 0xe7, 0xd4, 0xef, 0x61, 0xae, 0x00,
0xd5, 0x3b, 0x41, 0x52, 0x7a, 0x26, 0x1e, 0xdf, 0xc2, 0xba, 0x78, 0x57, 0xc1, 0x93, 0x2d
	};

	unsigned char data0_processed[31];
	unsigned char mac0[16];

	unsigned char seq63[] = {
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x3F,
	};

	const unsigned char rec63_header[] = {
0x17, 0x03, 0x03, 0x10, 0x00
	};

	unsigned char data63[4096];

	const unsigned char mac63_etl[16] = {
0x0A, 0x3B, 0xFD, 0x43, 0x0F, 0xCD, 0xD8, 0xD8, 0x5C, 0x96, 0x46, 0x86, 0x81, 0x78, 0x4F, 0x7D
	};

	const unsigned char enc63_etl_head[32] = {
0x6A, 0x18, 0x38, 0xB0, 0xA0, 0xD5, 0xA0, 0x4D, 0x1F, 0x29, 0x64, 0x89, 0x6D, 0x08, 0x5F, 0xB7, 
0xDA, 0x84, 0xD7, 0x76, 0xC3, 0x9F, 0x5C, 0xDC, 0x37, 0x20, 0xB7, 0xB5, 0x59, 0xEF, 0x13, 0x9D
	};
	const unsigned char enc63_etl_tail[48] = {
0x0A, 0x81, 0x29, 0x9B, 0x35, 0x98, 0x19, 0x5D, 0xD4, 0x51, 0x68, 0xA6, 0x38, 0x50, 0xA7, 0x6E, 
0x1A, 0x4F, 0x1E, 0x6D, 0xD5, 0xEF, 0x72, 0x59, 0x3F, 0xAE, 0x76, 0x55, 0x71, 0xEC, 0x37, 0xE7, 
0x17, 0xF5, 0xB8, 0x62, 0x85, 0xBB, 0x5B, 0xFD, 0x83, 0xB6, 0x6A, 0xB7, 0x63, 0x86, 0x52, 0x08
	};

	unsigned char data63_processed[4096+16];
	unsigned char mac63[16];

	EVP_MD_CTX *mdctx = EVP_MD_CTX_new();
	EVP_CIPHER_CTX *enc = NULL;
	const EVP_MD *md;
	const EVP_CIPHER *ciph;
	EVP_PKEY *mac_key;
	size_t mac_len;
	int i;

	OPENSSL_init_crypto(OPENSSL_INIT_LOAD_CONFIG, NULL);

	memset(data63, 0, 4096);

	md = EVP_get_digestbynid(NID_grasshopper_mac);

	EVP_DigestInit_ex(mdctx, md, NULL);
  mac_key = EVP_PKEY_new_mac_key(NID_grasshopper_mac, NULL, mac_secret, 32);
  EVP_DigestSignInit(mdctx, NULL, md, NULL, mac_key);
  EVP_PKEY_free(mac_key);

	EVP_MD_CTX_ctrl(mdctx, EVP_MD_CTRL_TLSTREE, 0, seq0);
	EVP_DigestSignUpdate(mdctx, seq0, 8);
	EVP_DigestSignUpdate(mdctx, rec0_header, 5);
	EVP_DigestSignUpdate(mdctx, data0, 15);
	EVP_DigestSignFinal(mdctx, mac0, &mac_len);

	EVP_MD_CTX_free(mdctx);
	hexdump(stderr, "MAC0 result", mac0, mac_len);
	if (memcmp(mac0, mac0_etl, 16) != 0) {
		fprintf(stderr, "MAC0 mismatch");
		exit(1);
	}

	ciph = EVP_get_cipherbynid(NID_id_tc26_cipher_gostr3412_2015_kuznyechik_ctracpkm);
	enc = EVP_CIPHER_CTX_new();
	if (EVP_EncryptInit_ex(enc, ciph, NULL, enc_key, full_iv) <= 0) {
		fprintf(stderr, "Internal error");
		exit(1);
	}

	for (i = 7; i >= 0; i--) {
		++seq0[i];
		if (seq0[i] != 0)
			break;
	}
	EVP_CIPHER_CTX_ctrl(enc, EVP_CTRL_TLSTREE, 0, seq0);
	EVP_Cipher(enc, data0_processed, data0, sizeof(data0));
	EVP_Cipher(enc, data0_processed+sizeof(data0), mac0, 16);

	hexdump(stderr, "ENC0 result", data0_processed, 31);
	if (memcmp(enc0_etl, data0_processed, sizeof(data0_processed)) != 0) {
		fprintf(stderr, "ENC0 mismatch");
		exit(1);
	}

	mdctx = EVP_MD_CTX_new();
	EVP_DigestInit_ex(mdctx, md, NULL);
  mac_key = EVP_PKEY_new_mac_key(NID_grasshopper_mac, NULL, mac_secret, 32);
  EVP_DigestSignInit(mdctx, NULL, md, NULL, mac_key);
  EVP_PKEY_free(mac_key);

	EVP_MD_CTX_ctrl(mdctx, EVP_MD_CTRL_TLSTREE, 0, seq63);
	EVP_DigestSignUpdate(mdctx, seq63, 8);
	EVP_DigestSignUpdate(mdctx, rec63_header, 5);
	EVP_DigestSignUpdate(mdctx, data63, 4096);
	EVP_DigestSignFinal(mdctx, mac63, &mac_len);

	EVP_MD_CTX_free(mdctx);
	hexdump(stderr, "MAC63 result", mac63, mac_len);
	if (memcmp(mac63, mac63_etl, 16) != 0) {
		fprintf(stderr, "MAC63 mismatch");
		exit(1);
	}

	for (i = 7; i >= 0; i--) {
		++seq63[i];
		if (seq63[i] != 0)
			break;
	}
	EVP_CIPHER_CTX_ctrl(enc, EVP_CTRL_TLSTREE, 0, seq63);
	EVP_Cipher(enc, data63_processed, data63, sizeof(data63));
	EVP_Cipher(enc, data63_processed+sizeof(data63), mac63, 16);

	hexdump(stderr, "ENC63 result: head", data63_processed, 32);
	if (memcmp(enc63_etl_head, data63_processed, sizeof(enc63_etl_head)) != 0) {
		fprintf(stderr, "ENC63 mismatch: head");
		exit(1);
	}
	hexdump(stderr, "ENC63 result: tail", data63_processed+4096+16-48, 48);
	if (memcmp(enc63_etl_tail, data63_processed+4096+16-48, sizeof(enc63_etl_tail)) != 0) {
		fprintf(stderr, "ENC63 mismatch: tail");
		exit(1);
	}

#endif
	return 0;
}